

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

string * __thiscall pbrt::Interval<float>::ToString_abi_cxx11_(Interval<float> *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<float_const&,float_const&>(in_stack_00000018,in_stack_00000010,&this->low);
  return in_RDI;
}

Assistant:

std::string Interval<Float>::ToString() const {
    return StringPrintf("[ Interval [%f, %f] ]", low, high);
}